

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesGroupInfo.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XercesGroupInfo::serialize(XercesGroupInfo *this,XSerializeEngine *serEng)

{
  bool bVar1;
  XSerializeEngine *serEng_local;
  XercesGroupInfo *this_local;
  
  bVar1 = XSerializeEngine::isStoring(serEng);
  if (bVar1) {
    XSerializeEngine::operator<<(serEng,(bool)(this->fCheckElementConsistency & 1));
    XSerializeEngine::operator<<(serEng,this->fScope);
    XSerializeEngine::operator<<(serEng,this->fNameId);
    XSerializeEngine::operator<<(serEng,this->fNamespaceId);
    operator<<(serEng,&this->fContentSpec->super_XSerializable);
    XTemplateSerializer::storeObject(this->fElements,serEng);
    operator<<(serEng,&this->fBaseGroup->super_XSerializable);
  }
  else {
    XSerializeEngine::operator>>(serEng,&this->fCheckElementConsistency);
    XSerializeEngine::operator>>(serEng,&this->fScope);
    XSerializeEngine::operator>>(serEng,&this->fNameId);
    XSerializeEngine::operator>>(serEng,&this->fNamespaceId);
    xercesc_4_0::operator>>(serEng,&this->fContentSpec);
    XTemplateSerializer::loadObject(&this->fElements,4,false,serEng);
    xercesc_4_0::operator>>(serEng,&this->fBaseGroup);
    this->fLocator = (XSDLocator *)0x0;
  }
  return;
}

Assistant:

void XercesGroupInfo::serialize(XSerializeEngine& serEng)
{
    if (serEng.isStoring())
    {   
        serEng<<fCheckElementConsistency;
        serEng<<fScope;
        serEng<<fNameId;
        serEng<<fNamespaceId;
        serEng<<fContentSpec;

        /***
         *
         * Serialize RefVectorOf<SchemaElementDecl>* fElements;
         *
         ***/

        XTemplateSerializer::storeObject(fElements, serEng);

        serEng<<fBaseGroup;

        //don't serialize     XSDLocator* fLocator;
    }
    else
    {
        serEng>>fCheckElementConsistency;
        serEng>>fScope;
        serEng>>fNameId;
        serEng>>fNamespaceId;
        serEng>>fContentSpec;

        /***
         * 
         * Deserialize RefVectorOf<SchemaElementDecl>*    fElements;
         *
         ***/
        XTemplateSerializer::loadObject(&fElements, 4, false, serEng);

        serEng>>fBaseGroup;

        //don't serialize     XSDLocator* fLocator;
        fLocator = 0;
    }

}